

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::link_estim(HighsNodeQueue *this,int64_t node)

{
  char *__to;
  char *in_RSI;
  NodeHybridEstimRbTree rbTree;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> in_stack_ffffffffffffffd8;
  NodeHybridEstimRbTree *in_stack_ffffffffffffffe0;
  
  NodeHybridEstimRbTree::NodeHybridEstimRbTree
            (in_stack_ffffffffffffffe0,(HighsNodeQueue *)in_stack_ffffffffffffffd8.rootNode);
  ::highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
            ((RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)&stack0xffffffffffffffd8,in_RSI,__to);
  return;
}

Assistant:

void HighsNodeQueue::link_estim(int64_t node) {
  assert(node != -1);
  NodeHybridEstimRbTree rbTree(this);
  rbTree.link(node);
}